

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

Aig_Man_t * Cgt_ManDeriveAigForGating(Cgt_Man_t *p)

{
  int iVar1;
  Aig_Man_t *p_00;
  char *pcVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  void *pvVar5;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  int local_54;
  int i;
  Vec_Ptr_t *vCopy1;
  Vec_Ptr_t *vCopy0;
  Aig_Obj_t *pMiter;
  Aig_Obj_t *pCare;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Cgt_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pAig);
  if (iVar1 != 0) {
    iVar1 = Aig_ManObjNumMax(p->pAig);
    p_00 = Aig_ManStart(iVar1);
    pcVar2 = Abc_UtilStrsav("CG_miter");
    p_00->pName = pcVar2;
    pAVar3 = Aig_ManConst1(p_00);
    pAVar4 = Aig_ManConst1(p->pAig);
    (pAVar4->field_5).pData = pAVar3;
    for (local_54 = 0; iVar1 = Vec_PtrSize(p->pAig->vCis), local_54 < iVar1; local_54 = local_54 + 1
        ) {
      pvVar5 = Vec_PtrEntry(p->pAig->vCis,local_54);
      pAVar3 = Aig_ObjCreateCi(p_00);
      *(Aig_Obj_t **)((long)pvVar5 + 0x28) = pAVar3;
    }
    for (local_54 = 0; iVar1 = Vec_PtrSize(p->pAig->vObjs), local_54 < iVar1;
        local_54 = local_54 + 1) {
      pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vObjs,local_54);
      if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
        pAVar4 = Aig_ObjChild0Copy(pAVar3);
        pAVar6 = Aig_ObjChild1Copy(pAVar3);
        pAVar4 = Aig_And(p_00,pAVar4,pAVar6);
        (pAVar3->field_5).pData = pAVar4;
      }
    }
    if (p->pPars->nOdcMax < 1) {
      for (local_54 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_54 < iVar1; local_54 = local_54 + 1)
      {
        pAVar4 = Saig_ManLi(p->pAig,local_54);
        pAVar3 = Saig_ManLo(p->pAig,local_54);
        pAVar3 = (Aig_Obj_t *)(pAVar3->field_5).pData;
        pAVar6 = Aig_ObjChild0Copy(pAVar4);
        pAVar3 = Aig_Exor(p_00,pAVar3,pAVar6);
        pAVar3 = Aig_ObjCreateCo(p_00,pAVar3);
        (pAVar4->field_5).pData = pAVar3;
      }
    }
    else {
      iVar1 = Aig_ManObjNumMax(p->pAig);
      p_01 = Vec_PtrStart(iVar1);
      iVar1 = Aig_ManObjNumMax(p->pAig);
      p_02 = Vec_PtrStart(iVar1);
      for (local_54 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_54 < iVar1; local_54 = local_54 + 1)
      {
        pAVar3 = Saig_ManLi(p->pAig,local_54);
        pAVar4 = Saig_ManLo(p->pAig,local_54);
        iVar1 = Aig_ObjId(pAVar4);
        pAVar6 = Aig_ObjChild0Copy(pAVar3);
        Vec_PtrWriteEntry(p_01,iVar1,pAVar6);
        iVar1 = Aig_ObjId(pAVar4);
        pAVar3 = Aig_ObjChild0Copy(pAVar3);
        Vec_PtrWriteEntry(p_02,iVar1,pAVar3);
      }
      for (local_54 = 0; iVar1 = Saig_ManRegNum(p->pAig), local_54 < iVar1; local_54 = local_54 + 1)
      {
        pAVar4 = Saig_ManLi(p->pAig,local_54);
        pAVar3 = Saig_ManLo(p->pAig,local_54);
        iVar1 = Aig_ObjId(pAVar3);
        pAVar6 = Aig_ManConst0(p_00);
        Vec_PtrWriteEntry(p_01,iVar1,pAVar6);
        iVar1 = Aig_ObjId(pAVar3);
        pAVar6 = Aig_ManConst1(p_00);
        Vec_PtrWriteEntry(p_02,iVar1,pAVar6);
        pAVar6 = Cgt_ManConstructCareCondition(p,p_00,pAVar3,p_01,p_02);
        iVar1 = Aig_ObjId(pAVar3);
        pAVar7 = Aig_ObjChild0Copy(pAVar4);
        Vec_PtrWriteEntry(p_01,iVar1,pAVar7);
        iVar1 = Aig_ObjId(pAVar3);
        pAVar7 = Aig_ObjChild0Copy(pAVar4);
        Vec_PtrWriteEntry(p_02,iVar1,pAVar7);
        pAVar3 = (Aig_Obj_t *)(pAVar3->field_5).pData;
        pAVar7 = Aig_ObjChild0Copy(pAVar4);
        pAVar3 = Aig_Exor(p_00,pAVar3,pAVar7);
        pAVar3 = Aig_And(p_00,pAVar3,pAVar6);
        pAVar3 = Aig_ObjCreateCo(p_00,pAVar3);
        (pAVar4->field_5).pData = pAVar3;
      }
      Vec_PtrFree(p_01);
      Vec_PtrFree(p_02);
    }
    Aig_ManCleanup(p_00);
    Aig_ManSetCioIds(p_00);
    return p_00;
  }
  __assert_fail("Aig_ManRegNum(p->pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/cgt/cgtAig.c"
                ,0x110,"Aig_Man_t *Cgt_ManDeriveAigForGating(Cgt_Man_t *)");
}

Assistant:

Aig_Man_t * Cgt_ManDeriveAigForGating( Cgt_Man_t * p )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pCare, * pMiter;
    Vec_Ptr_t * vCopy0, * vCopy1;
    int i;
    assert( Aig_ManRegNum(p->pAig) );
    pNew = Aig_ManStart( Aig_ManObjNumMax(p->pAig) );
    pNew->pName = Abc_UtilStrsav( "CG_miter" );
    // build the first frame
    Aig_ManConst1(p->pAig)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p->pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    Aig_ManForEachNode( p->pAig, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
//    Saig_ManForEachPo( p->pAig, pObj, i )
//        pObj->pData = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    if ( p->pPars->nOdcMax > 0 )
    {
        // create storage for observability conditions
        vCopy0 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        vCopy1 = Vec_PtrStart( Aig_ManObjNumMax(p->pAig) );
        // initialize register outputs
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
        }
        // compute observability condition for each latch output
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            // set the constants
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ManConst0(pNew) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ManConst1(pNew) );
            // compute condition
            pCare = Cgt_ManConstructCareCondition( p, pNew, pObjLo, vCopy0, vCopy1 );
            // restore the values
            Vec_PtrWriteEntry( vCopy0, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            Vec_PtrWriteEntry( vCopy1, Aig_ObjId(pObjLo), Aig_ObjChild0Copy(pObjLi) );
            // compute the miter
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pMiter = Aig_And( pNew, pMiter, pCare );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
        Vec_PtrFree( vCopy0 );
        Vec_PtrFree( vCopy1 );
    }
    else
    {
        // construct clock-gating miters for each register input
        Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        {
            pMiter = Aig_Exor( pNew, (Aig_Obj_t *)pObjLo->pData, Aig_ObjChild0Copy(pObjLi) );
            pObjLi->pData = Aig_ObjCreateCo( pNew, pMiter );
        }
    }
    Aig_ManCleanup( pNew );
    Aig_ManSetCioIds( pNew );
    return pNew;
}